

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread_pthread.c
# Opt level: O1

int evthread_posix_cond_signal(void *cond_,int broadcast)

{
  int iVar1;
  
  if (broadcast == 0) {
    iVar1 = pthread_cond_signal((pthread_cond_t *)cond_);
  }
  else {
    iVar1 = pthread_cond_broadcast((pthread_cond_t *)cond_);
  }
  return -(uint)(iVar1 != 0);
}

Assistant:

static int
evthread_posix_cond_signal(void *cond_, int broadcast)
{
	pthread_cond_t *cond = cond_;
	int r;
	if (broadcast)
		r = pthread_cond_broadcast(cond);
	else
		r = pthread_cond_signal(cond);
	return r ? -1 : 0;
}